

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O3

ssize_t __thiscall
sc_core::vcd_T_trace<sc_dt::sc_bv_base>::write
          (vcd_T_trace<sc_dt::sc_bv_base> *this,int __fd,void *__buf,size_t __n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  sc_bv_base *psVar2;
  int iVar3;
  undefined4 in_register_00000034;
  sc_bv_base *x;
  string s;
  string local_70;
  string local_50;
  
  iVar3 = this->object->m_len;
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (0 < iVar3) {
    do {
      iVar3 = iVar3 + -1;
      std::__cxx11::string::push_back((char)&local_70);
    } while (iVar3 != 0);
  }
  vcd_trace::compose_line(&local_50,&this->super_vcd_trace,&local_70);
  fputs(local_50._M_dataplus._M_p,(FILE *)CONCAT44(in_register_00000034,__fd));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  psVar2 = sc_dt::sc_bv_base::operator=(&this->old_value,this->object);
  return (ssize_t)psVar2;
}

Assistant:

void write( FILE* f )
    {
        std::fprintf( f, "%s", compose_line( object.to_string() ).c_str() );
        old_value = object;
    }